

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXMeshGeometry.cpp
# Opt level: O0

uint * __thiscall
Assimp::FBX::MeshGeometry::ToOutputVertexIndex(MeshGeometry *this,uint in_index,uint *count)

{
  value_type vVar1;
  uint uVar2;
  size_type sVar3;
  size_type sVar4;
  const_reference pvVar5;
  uint *count_local;
  uint in_index_local;
  MeshGeometry *this_local;
  
  sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->m_mapping_counts);
  if (in_index < sVar3) {
    sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->m_mapping_counts);
    sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->m_mapping_offsets)
    ;
    if (sVar3 != sVar4) {
      __assert_fail("m_mapping_counts.size() == m_mapping_offsets.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXMeshGeometry.cpp"
                    ,0xf7,
                    "const unsigned int *Assimp::FBX::MeshGeometry::ToOutputVertexIndex(unsigned int, unsigned int &) const"
                   );
    }
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->m_mapping_counts,(ulong)in_index);
    *count = *pvVar5;
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->m_mapping_offsets,(ulong)in_index);
    vVar1 = *pvVar5;
    uVar2 = *count;
    sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->m_mappings);
    if (sVar3 < vVar1 + uVar2) {
      __assert_fail("m_mapping_offsets[ in_index ] + count <= m_mappings.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXMeshGeometry.cpp"
                    ,0xfa,
                    "const unsigned int *Assimp::FBX::MeshGeometry::ToOutputVertexIndex(unsigned int, unsigned int &) const"
                   );
    }
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->m_mapping_offsets,(ulong)in_index);
    this_local = (MeshGeometry *)
                 std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (&this->m_mappings,(ulong)*pvVar5);
  }
  else {
    this_local = (MeshGeometry *)0x0;
  }
  return (uint *)this_local;
}

Assistant:

const unsigned int* MeshGeometry::ToOutputVertexIndex( unsigned int in_index, unsigned int& count ) const {
    if ( in_index >= m_mapping_counts.size() ) {
        return NULL;
    }

    ai_assert( m_mapping_counts.size() == m_mapping_offsets.size() );
    count = m_mapping_counts[ in_index ];

    ai_assert( m_mapping_offsets[ in_index ] + count <= m_mappings.size() );

    return &m_mappings[ m_mapping_offsets[ in_index ] ];
}